

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink-inl.h
# Opt level: O0

void __thiscall spdlog::sinks::sink::set_level(sink *this,level_enum log_level)

{
  undefined4 in_ESI;
  long in_RDI;
  memory_order __b;
  
  CLI::std::operator&(relaxed,__memory_order_mask);
  *(undefined4 *)(in_RDI + 8) = in_ESI;
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::sinks::sink::set_level(level::level_enum log_level) {
    level_.store(log_level, std::memory_order_relaxed);
}